

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

char * whereTempTriggers(Parse *pParse,Table *pTab)

{
  sqlite3 *db_00;
  Parse *pParse_00;
  Trigger *pTVar1;
  char *zWhere;
  char *pcVar2;
  sqlite3 *db;
  
  db_00 = pParse->db;
  pParse_00 = (Parse *)db_00->aDb[1].pSchema;
  if (((Parse *)pTab->pSchema != pParse_00) &&
     (pTVar1 = sqlite3TriggerList(pParse_00,(Table *)(ulong)pParse->disableTriggers),
     pTVar1 != (Trigger *)0x0)) {
    zWhere = (char *)0x0;
    do {
      if ((Parse *)pTVar1->pSchema == pParse_00) {
        zWhere = whereOrName(db_00,zWhere,pTVar1->zName);
      }
      pTVar1 = pTVar1->pNext;
    } while (pTVar1 != (Trigger *)0x0);
    if (zWhere != (char *)0x0) {
      pcVar2 = sqlite3MPrintf(pParse->db,"type=\'trigger\' AND (%s)",zWhere);
      sqlite3DbFree(pParse->db,zWhere);
      return pcVar2;
    }
  }
  return (char *)0x0;
}

Assistant:

static char *whereTempTriggers(Parse *pParse, Table *pTab){
  Trigger *pTrig;
  char *zWhere = 0;
  const Schema *pTempSchema = pParse->db->aDb[1].pSchema; /* Temp db schema */

  /* If the table is not located in the temp-db (in which case NULL is 
  ** returned, loop through the tables list of triggers. For each trigger
  ** that is not part of the temp-db schema, add a clause to the WHERE 
  ** expression being built up in zWhere.
  */
  if( pTab->pSchema!=pTempSchema ){
    sqlite3 *db = pParse->db;
    for(pTrig=sqlite3TriggerList(pParse, pTab); pTrig; pTrig=pTrig->pNext){
      if( pTrig->pSchema==pTempSchema ){
        zWhere = whereOrName(db, zWhere, pTrig->zName);
      }
    }
  }
  if( zWhere ){
    char *zNew = sqlite3MPrintf(pParse->db, "type='trigger' AND (%s)", zWhere);
    sqlite3DbFree(pParse->db, zWhere);
    zWhere = zNew;
  }
  return zWhere;
}